

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAcurv::VariablesQbSetSpeed(ChNodeFEAcurv *this,double step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ChVectorRef local_68;
  long local_50 [3];
  ChVectorRef *local_38;
  undefined8 local_30;
  long local_20;
  
  dVar1 = (this->m_rxx_dt).m_data[0];
  dVar2 = (this->m_rxx_dt).m_data[1];
  dVar3 = (this->m_rxx_dt).m_data[2];
  dVar4 = (this->m_ryy_dt).m_data[0];
  dVar5 = (this->m_ryy_dt).m_data[1];
  dVar6 = (this->m_ryy_dt).m_data[2];
  dVar7 = (this->m_rzz_dt).m_data[0];
  dVar8 = (this->m_rzz_dt).m_data[1];
  dVar9 = (this->m_rzz_dt).m_data[2];
  ChVariables::Get_qb(&local_68,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  local_50[0] = local_68.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._0_8_;
  local_50[1] = 3;
  local_30 = 0;
  local_20 = local_68.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_;
  if (2 < (long)local_68.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_) {
    local_38 = &local_68;
    ChVector<double>::operator=
              (&this->m_rxx_dt,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)local_50);
    ChVariables::Get_qb(&local_68,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
    local_50[0] = local_68.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._0_8_ + 0x18;
    local_50[1] = 3;
    local_30 = 3;
    local_20 = local_68.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_;
    if (5 < (long)local_68.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_) {
      local_38 = &local_68;
      ChVector<double>::operator=
                (&this->m_ryy_dt,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)local_50);
      ChVariables::Get_qb(&local_68,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
      local_50[0] = local_68.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._0_8_ + 0x30;
      local_50[1] = 3;
      local_30 = 6;
      local_20 = local_68.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_;
      if (8 < (long)local_68.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._8_8_) {
        local_38 = &local_68;
        ChVector<double>::operator=
                  (&this->m_rzz_dt,
                   (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                    *)local_50);
        if ((step != 0.0) || (NAN(step))) {
          dVar12 = 1.0 / step;
          dVar10 = (this->m_rxx_dt).m_data[2];
          dVar11 = (this->m_rxx_dt).m_data[1];
          (this->m_rxx_dtdt).m_data[0] = dVar12 * ((this->m_rxx_dt).m_data[0] - dVar1);
          (this->m_rxx_dtdt).m_data[1] = dVar12 * (dVar11 - dVar2);
          (this->m_rxx_dtdt).m_data[2] = dVar12 * (dVar10 - dVar3);
          dVar1 = (this->m_ryy_dt).m_data[2];
          dVar2 = (this->m_ryy_dt).m_data[1];
          (this->m_ryy_dtdt).m_data[0] = dVar12 * ((this->m_ryy_dt).m_data[0] - dVar4);
          (this->m_ryy_dtdt).m_data[1] = dVar12 * (dVar2 - dVar5);
          (this->m_ryy_dtdt).m_data[2] = dVar12 * (dVar1 - dVar6);
          dVar1 = (this->m_rzz_dt).m_data[2];
          dVar2 = (this->m_rzz_dt).m_data[1];
          (this->m_rzz_dtdt).m_data[0] = dVar12 * ((this->m_rzz_dt).m_data[0] - dVar7);
          (this->m_rzz_dtdt).m_data[1] = dVar12 * (dVar2 - dVar8);
          (this->m_rzz_dtdt).m_data[2] = dVar12 * (dVar1 - dVar9);
        }
        return;
      }
    }
  }
  local_50[1] = 3;
  local_38 = &local_68;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAcurv::VariablesQbSetSpeed(double step) {
    ChVector<> old_rxx_dt = m_rxx_dt;
    ChVector<> old_ryy_dt = m_ryy_dt;
    ChVector<> old_rzz_dt = m_rzz_dt;

    m_rxx_dt = m_variables->Get_qb().segment(0, 3);
    m_ryy_dt = m_variables->Get_qb().segment(3, 3);
    m_rzz_dt = m_variables->Get_qb().segment(6, 3);

    if (step) {
        m_rxx_dtdt = (m_rxx_dt - old_rxx_dt) / step;
        m_ryy_dtdt = (m_ryy_dt - old_ryy_dt) / step;
        m_rzz_dtdt = (m_rzz_dt - old_rzz_dt) / step;
    }
}